

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O1

void __thiscall
cnn::InputNode::InputNode(InputNode *this,Dim *d,vector<float,_std::allocator<float>_> *dat)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_Node).dim.nd = 0;
  (this->super_Node).dim.bd = 1;
  (this->super_Node).args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Node).args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Node).args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__InputNode_002a4660;
  uVar1 = *(undefined8 *)(d->d + 2);
  uVar2 = *(undefined8 *)(d->d + 4);
  uVar3 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)d->d;
  *(undefined8 *)((this->dim).d + 2) = uVar1;
  *(undefined8 *)((this->dim).d + 4) = uVar2;
  *(undefined8 *)((this->dim).d + 6) = uVar3;
  (this->dim).bd = d->bd;
  std::vector<float,_std::allocator<float>_>::vector(&this->data,dat);
  this->pdata = &this->data;
  return;
}

Assistant:

explicit InputNode(const Dim& d, const std::vector<float>& dat) : dim(d), data(dat), pdata(&data) {}